

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_write_file_def(cram_fd *fd,cram_file_def *def)

{
  ssize_t sVar1;
  
  sVar1 = hwrite(fd->fp,def,0x1a);
  return -(uint)(sVar1 != 0x1a);
}

Assistant:

int cram_write_file_def(cram_fd *fd, cram_file_def *def) {
    return (hwrite(fd->fp, &def->magic[0], 26) == 26) ? 0 : -1;
}